

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

Int128 btConvexHullInternal::Int128::mul(int64_t a,int64_t b)

{
  unsigned_long b_00;
  unsigned_long a_00;
  Int128 IVar1;
  Int128 result;
  uint64_t local_28;
  ulong local_20;
  
  a_00 = -a;
  if (0 < a) {
    a_00 = a;
  }
  b_00 = -b;
  if (0 < b) {
    b_00 = b;
  }
  DMul<unsigned_long,_unsigned_int>::mul(a_00,b_00,&local_28,&local_20);
  if ((b ^ a) < 0) {
    local_20 = ~local_20 + (ulong)(local_28 == 0);
    local_28 = -local_28;
  }
  IVar1.high = local_20;
  IVar1.low = local_28;
  return IVar1;
}

Assistant:

btConvexHullInternal::Int128 btConvexHullInternal::Int128::mul(int64_t a, int64_t b)
{
	Int128 result;
	
#ifdef USE_X86_64_ASM
	__asm__ ("imulq %[b]"
					 : "=a" (result.low), "=d" (result.high)
					 : "0"(a), [b] "r"(b)
					 : "cc" );
	return result;
	
#else
	bool negative = a < 0;
	if (negative)
	{
		a = -a;
	}
	if (b < 0)
	{
		negative = !negative;
		b = -b;
	}
	DMul<uint64_t, uint32_t>::mul((uint64_t) a, (uint64_t) b, result.low, result.high);
	return negative ? -result : result;
#endif
}